

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O3

sunindextype GlobalVectorLength_DenseLS(N_Vector y)

{
  long lVar1;
  sunindextype sVar2;
  double dVar3;
  
  lVar1 = N_VClone();
  if (lVar1 == 0) {
    sVar2 = -1;
  }
  else {
    N_VConst(0x3ff0000000000000,lVar1);
    dVar3 = (double)N_VDotProd(lVar1,lVar1);
    N_VDestroy(lVar1);
    sVar2 = (sunindextype)dVar3;
  }
  return sVar2;
}

Assistant:

sunindextype GlobalVectorLength_DenseLS(N_Vector y)
{
  realtype len;
  N_Vector tmp = NULL;
  tmp = N_VClone(y);
  if (tmp == NULL)  return(-1);
  N_VConst(ONE, tmp);
  len = N_VDotProd(tmp, tmp);
  N_VDestroy(tmp);
  return( (sunindextype) len );
}